

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd_ext_to_khr.cpp
# Opt level: O0

bool spvtools::opt::anon_unknown_7::ReplaceSwizzleInvocationsMasked
               (IRContext *ctx,Instruction *inst,
               vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
               *param_3)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<unsigned_int> init_list_01;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  undefined8 uVar1;
  Analysis preserved_analyses;
  uint32_t uVar2;
  Op OVar3;
  uint32_t uVar4;
  uint32_t operand2;
  TypeManager *this;
  DefUseManager *pDVar5;
  Type *pTVar6;
  Constant *pCVar7;
  Instruction *pIVar8;
  uint32_t local_34c;
  iterator local_348;
  undefined8 local_340;
  SmallVector<unsigned_int,_2UL> local_338;
  Operand local_310;
  uint32_t local_2dc;
  iterator local_2d8;
  undefined8 local_2d0;
  SmallVector<unsigned_int,_2UL> local_2c8;
  Operand local_2a0;
  uint32_t local_26c;
  iterator local_268;
  undefined8 local_260;
  SmallVector<unsigned_int,_2UL> local_258;
  Operand local_230;
  undefined1 local_200 [8];
  OperandList new_operands;
  Instruction *null_inst;
  Constant *local_1c8;
  Constant *null;
  uint32_t local_1b8;
  uint32_t local_1b4;
  iterator local_1b0;
  size_type local_1a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1a0;
  Instruction *local_188;
  Instruction *shuffle;
  uint32_t local_178;
  uint32_t local_174;
  iterator local_170;
  size_type local_168;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_160;
  Instruction *local_148;
  Instruction *is_active;
  Instruction *ballot_value;
  uint32_t local_130;
  uint32_t local_12c;
  uint32_t local_128;
  uint32_t local_124;
  iterator local_120;
  size_type local_118;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_110;
  Constant *local_f8;
  Constant *ballot_value_const;
  uint32_t subgroup_scope;
  uint32_t uint_max_id;
  Instruction *target_inv;
  Instruction *or_result;
  Instruction *and_result;
  Instruction *and_mask;
  Instruction *pIStack_c0;
  uint32_t mask_extended;
  Instruction *id;
  Instruction *pIStack_b0;
  uint32_t uint_type_id;
  Instruction *var_ptr_type;
  Instruction *var_inst;
  string local_98;
  uint32_t local_78;
  uint32_t local_74;
  uint32_t var_id;
  uint32_t uint_z;
  uint32_t uint_y;
  uint32_t uint_x;
  Instruction *mask_inst;
  undefined1 local_58 [4];
  uint32_t data_id;
  InstructionBuilder ir_builder;
  ConstantManager *const_mgr;
  DefUseManager *def_use_mgr;
  TypeManager *type_mgr;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *param_2_local;
  Instruction *inst_local;
  IRContext *ctx_local;
  
  this = IRContext::get_type_mgr(ctx);
  pDVar5 = IRContext::get_def_use_mgr(ctx);
  ir_builder._24_8_ = IRContext::get_constant_mgr(ctx);
  IRContext::AddCapability(ctx,CapabilityGroupNonUniformBallot);
  IRContext::AddCapability(ctx,CapabilityGroupNonUniformShuffle);
  preserved_analyses = opt::operator|(kAnalysisBegin,kAnalysisInstrToBlockMapping);
  InstructionBuilder::InstructionBuilder((InstructionBuilder *)local_58,ctx,inst,preserved_analyses)
  ;
  mask_inst._4_4_ = opt::Instruction::GetSingleWordInOperand(inst,2);
  uVar2 = opt::Instruction::GetSingleWordInOperand(inst,3);
  _uint_y = analysis::DefUseManager::GetDef(pDVar5,uVar2);
  OVar3 = opt::Instruction::opcode(_uint_y);
  if (OVar3 != OpConstantComposite) {
    __assert_fail("mask_inst->opcode() == spv::Op::OpConstantComposite && \"The mask is suppose to be a vector constant.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/amd_ext_to_khr.cpp"
                  ,0x158,
                  "bool spvtools::opt::(anonymous namespace)::ReplaceSwizzleInvocationsMasked(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &)"
                 );
  }
  uVar2 = opt::Instruction::NumInOperands(_uint_y);
  if (uVar2 != 3) {
    __assert_fail("mask_inst->NumInOperands() == 3 && \"The mask is suppose to have 3 components.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/amd_ext_to_khr.cpp"
                  ,0x15a,
                  "bool spvtools::opt::(anonymous namespace)::ReplaceSwizzleInvocationsMasked(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &)"
                 );
  }
  uint_z = opt::Instruction::GetSingleWordInOperand(_uint_y,0);
  var_id = opt::Instruction::GetSingleWordInOperand(_uint_y,1);
  local_74 = opt::Instruction::GetSingleWordInOperand(_uint_y,2);
  local_78 = IRContext::GetBuiltinInputVarId(ctx,0x29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"SPV_KHR_shader_ballot",(allocator<char> *)((long)&var_inst + 7));
  IRContext::AddExtension(ctx,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)((long)&var_inst + 7));
  if (local_78 == 0) {
    __assert_fail("var_id != 0 && \"Could not get SubgroupLocalInvocationId variable.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/amd_ext_to_khr.cpp"
                  ,0x164,
                  "bool spvtools::opt::(anonymous namespace)::ReplaceSwizzleInvocationsMasked(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &)"
                 );
  }
  pDVar5 = IRContext::get_def_use_mgr(ctx);
  var_ptr_type = analysis::DefUseManager::GetDef(pDVar5,local_78);
  pDVar5 = IRContext::get_def_use_mgr(ctx);
  uVar2 = opt::Instruction::type_id(var_ptr_type);
  pIStack_b0 = analysis::DefUseManager::GetDef(pDVar5,uVar2);
  id._4_4_ = opt::Instruction::GetSingleWordInOperand(pIStack_b0,1);
  pIStack_c0 = InstructionBuilder::AddLoad((InstructionBuilder *)local_58,id._4_4_,local_78,0);
  and_mask._4_4_ = InstructionBuilder::GetUintConstantId((InstructionBuilder *)local_58,0xffffffe0);
  and_result = InstructionBuilder::AddBinaryOp
                         ((InstructionBuilder *)local_58,id._4_4_,OpBitwiseOr,uint_z,and_mask._4_4_)
  ;
  uVar2 = id._4_4_;
  uVar4 = opt::Instruction::result_id(pIStack_c0);
  operand2 = opt::Instruction::result_id(and_result);
  or_result = InstructionBuilder::AddBinaryOp
                        ((InstructionBuilder *)local_58,uVar2,OpBitwiseAnd,uVar4,operand2);
  uVar2 = id._4_4_;
  uVar4 = opt::Instruction::result_id(or_result);
  target_inv = InstructionBuilder::AddBinaryOp
                         ((InstructionBuilder *)local_58,uVar2,OpBitwiseOr,uVar4,var_id);
  uVar2 = id._4_4_;
  uVar4 = opt::Instruction::result_id(target_inv);
  _subgroup_scope =
       InstructionBuilder::AddBinaryOp
                 ((InstructionBuilder *)local_58,uVar2,OpBitwiseXor,uVar4,local_74);
  ballot_value_const._4_4_ =
       InstructionBuilder::GetUintConstantId((InstructionBuilder *)local_58,0xffffffff);
  ballot_value_const._0_4_ = InstructionBuilder::GetUintConstantId((InstructionBuilder *)local_58,3)
  ;
  uVar1 = ir_builder._24_8_;
  pTVar6 = analysis::TypeManager::GetUIntVectorType(this,4);
  local_130 = ballot_value_const._4_4_;
  local_12c = ballot_value_const._4_4_;
  local_128 = ballot_value_const._4_4_;
  local_124 = ballot_value_const._4_4_;
  local_120 = &local_130;
  local_118 = 4;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&ballot_value + 7));
  __l_01._M_len = local_118;
  __l_01._M_array = local_120;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_110,__l_01,(allocator_type *)((long)&ballot_value + 7));
  pCVar7 = analysis::ConstantManager::GetConstant((ConstantManager *)uVar1,pTVar6,&local_110);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_110);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&ballot_value + 7));
  local_f8 = pCVar7;
  is_active = analysis::ConstantManager::GetDefiningInstruction
                        ((ConstantManager *)ir_builder._24_8_,pCVar7,0,(inst_iterator *)0x0);
  uVar2 = analysis::TypeManager::GetBoolTypeId(this);
  shuffle._4_4_ = (uint32_t)ballot_value_const;
  local_178 = opt::Instruction::result_id(is_active);
  local_174 = opt::Instruction::result_id(_subgroup_scope);
  local_170 = (iterator)((long)&shuffle + 4);
  local_168 = 3;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&shuffle + 3));
  __l_00._M_len = local_168;
  __l_00._M_array = local_170;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_160,__l_00,(allocator_type *)((long)&shuffle + 3));
  pIVar8 = InstructionBuilder::AddNaryOp
                     ((InstructionBuilder *)local_58,uVar2,OpGroupNonUniformBallotBitExtract,
                      &local_160,0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_160);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&shuffle + 3));
  local_148 = pIVar8;
  uVar2 = opt::Instruction::type_id(inst);
  null._4_4_ = (uint32_t)ballot_value_const;
  local_1b8 = mask_inst._4_4_;
  local_1b4 = opt::Instruction::result_id(_subgroup_scope);
  local_1b0 = (iterator)((long)&null + 4);
  local_1a8 = 3;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&null + 3));
  __l._M_len = local_1a8;
  __l._M_array = local_1b0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_1a0,__l,(allocator_type *)((long)&null + 3));
  pIVar8 = InstructionBuilder::AddNaryOp
                     ((InstructionBuilder *)local_58,uVar2,OpGroupNonUniformShuffle,&local_1a0,0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_1a0);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&null + 3));
  uVar1 = ir_builder._24_8_;
  local_188 = pIVar8;
  uVar2 = opt::Instruction::type_id(inst);
  pTVar6 = analysis::TypeManager::GetType(this,uVar2);
  memset(&null_inst,0,0x18);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&null_inst);
  pCVar7 = analysis::ConstantManager::GetConstant
                     ((ConstantManager *)uVar1,pTVar6,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&null_inst);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&null_inst);
  local_1c8 = pCVar7;
  new_operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)analysis::ConstantManager::GetDefiningInstruction
                          ((ConstantManager *)ir_builder._24_8_,pCVar7,0,(inst_iterator *)0x0);
  opt::Instruction::SetOpcode(inst,OpSelect);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_200);
  local_26c = opt::Instruction::result_id(local_148);
  local_268 = &local_26c;
  local_260 = 1;
  init_list_01._M_len = 1;
  init_list_01._M_array = local_268;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_258,init_list_01);
  Operand::Operand(&local_230,SPV_OPERAND_TYPE_ID,&local_258);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_200,
             &local_230);
  Operand::~Operand(&local_230);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_258);
  local_2dc = opt::Instruction::result_id(local_188);
  local_2d8 = &local_2dc;
  local_2d0 = 1;
  init_list_00._M_len = 1;
  init_list_00._M_array = local_2d8;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_2c8,init_list_00);
  Operand::Operand(&local_2a0,SPV_OPERAND_TYPE_ID,&local_2c8);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_200,
             &local_2a0);
  Operand::~Operand(&local_2a0);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_2c8);
  local_34c = opt::Instruction::result_id
                        ((Instruction *)
                         new_operands.
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_348 = &local_34c;
  local_340 = 1;
  init_list._M_len = 1;
  init_list._M_array = local_348;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_338,init_list);
  Operand::Operand(&local_310,SPV_OPERAND_TYPE_ID,&local_338);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_200,
             &local_310);
  Operand::~Operand(&local_310);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_338);
  opt::Instruction::SetInOperands(inst,(OperandList *)local_200);
  IRContext::UpdateDefUse(ctx,inst);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_200);
  return true;
}

Assistant:

bool ReplaceSwizzleInvocationsMasked(
    IRContext* ctx, Instruction* inst,
    const std::vector<const analysis::Constant*>&) {
  analysis::TypeManager* type_mgr = ctx->get_type_mgr();
  analysis::DefUseManager* def_use_mgr = ctx->get_def_use_mgr();
  analysis::ConstantManager* const_mgr = ctx->get_constant_mgr();

  ctx->AddCapability(spv::Capability::GroupNonUniformBallot);
  ctx->AddCapability(spv::Capability::GroupNonUniformShuffle);

  InstructionBuilder ir_builder(
      ctx, inst,
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);

  // Get the operands to inst, and the components of the mask
  uint32_t data_id = inst->GetSingleWordInOperand(2);

  Instruction* mask_inst = def_use_mgr->GetDef(inst->GetSingleWordInOperand(3));
  assert(mask_inst->opcode() == spv::Op::OpConstantComposite &&
         "The mask is suppose to be a vector constant.");
  assert(mask_inst->NumInOperands() == 3 &&
         "The mask is suppose to have 3 components.");

  uint32_t uint_x = mask_inst->GetSingleWordInOperand(0);
  uint32_t uint_y = mask_inst->GetSingleWordInOperand(1);
  uint32_t uint_z = mask_inst->GetSingleWordInOperand(2);

  // Get the subgroup invocation id.
  uint32_t var_id = ctx->GetBuiltinInputVarId(
      uint32_t(spv::BuiltIn::SubgroupLocalInvocationId));
  ctx->AddExtension("SPV_KHR_shader_ballot");
  assert(var_id != 0 && "Could not get SubgroupLocalInvocationId variable.");
  Instruction* var_inst = ctx->get_def_use_mgr()->GetDef(var_id);
  Instruction* var_ptr_type =
      ctx->get_def_use_mgr()->GetDef(var_inst->type_id());
  uint32_t uint_type_id = var_ptr_type->GetSingleWordInOperand(1);

  Instruction* id = ir_builder.AddLoad(uint_type_id, var_id);

  // Do the bitwise operations.
  uint32_t mask_extended = ir_builder.GetUintConstantId(0xFFFFFFE0);
  Instruction* and_mask = ir_builder.AddBinaryOp(
      uint_type_id, spv::Op::OpBitwiseOr, uint_x, mask_extended);
  Instruction* and_result =
      ir_builder.AddBinaryOp(uint_type_id, spv::Op::OpBitwiseAnd,
                             id->result_id(), and_mask->result_id());
  Instruction* or_result = ir_builder.AddBinaryOp(
      uint_type_id, spv::Op::OpBitwiseOr, and_result->result_id(), uint_y);
  Instruction* target_inv = ir_builder.AddBinaryOp(
      uint_type_id, spv::Op::OpBitwiseXor, or_result->result_id(), uint_z);

  // Do the group operations
  uint32_t uint_max_id = ir_builder.GetUintConstantId(0xFFFFFFFF);
  uint32_t subgroup_scope =
      ir_builder.GetUintConstantId(uint32_t(spv::Scope::Subgroup));
  const auto* ballot_value_const = const_mgr->GetConstant(
      type_mgr->GetUIntVectorType(4),
      {uint_max_id, uint_max_id, uint_max_id, uint_max_id});
  Instruction* ballot_value =
      const_mgr->GetDefiningInstruction(ballot_value_const);
  Instruction* is_active = ir_builder.AddNaryOp(
      type_mgr->GetBoolTypeId(), spv::Op::OpGroupNonUniformBallotBitExtract,
      {subgroup_scope, ballot_value->result_id(), target_inv->result_id()});
  Instruction* shuffle =
      ir_builder.AddNaryOp(inst->type_id(), spv::Op::OpGroupNonUniformShuffle,
                           {subgroup_scope, data_id, target_inv->result_id()});

  // Create the null constant to use in the select.
  const auto* null = const_mgr->GetConstant(type_mgr->GetType(inst->type_id()),
                                            std::vector<uint32_t>());
  Instruction* null_inst = const_mgr->GetDefiningInstruction(null);

  // Build the select.
  inst->SetOpcode(spv::Op::OpSelect);
  Instruction::OperandList new_operands;
  new_operands.push_back({SPV_OPERAND_TYPE_ID, {is_active->result_id()}});
  new_operands.push_back({SPV_OPERAND_TYPE_ID, {shuffle->result_id()}});
  new_operands.push_back({SPV_OPERAND_TYPE_ID, {null_inst->result_id()}});

  inst->SetInOperands(std::move(new_operands));
  ctx->UpdateDefUse(inst);
  return true;
}